

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf_write.h
# Opt level: O3

void cgltf_write_floatarrayprop
               (cgltf_write_context *context,char *label,cgltf_float *vals,cgltf_size dim)

{
  float fVar1;
  int iVar2;
  cgltf_size cVar3;
  cgltf_size cVar4;
  char *__s;
  char *__format;
  
  cgltf_write_indent(context);
  __s = (char *)0x0;
  iVar2 = snprintf(context->cursor,context->remaining,"\"%s\": [",label);
  cVar3 = (cgltf_size)iVar2;
  context->tmp = cVar3;
  context->chars_written = context->chars_written + cVar3;
  if (context->cursor != (char *)0x0) {
    __s = context->cursor + cVar3;
    context->cursor = __s;
    context->remaining = context->remaining - cVar3;
  }
  if (dim != 0) {
    cVar3 = 0;
    do {
      if (cVar3 == 0) {
        fVar1 = *vals;
        __format = "%.*g";
      }
      else {
        fVar1 = vals[cVar3];
        __format = ", %.*g";
      }
      iVar2 = snprintf(__s,context->remaining,__format,(double)fVar1,9);
      cVar4 = (cgltf_size)iVar2;
      context->tmp = cVar4;
      context->chars_written = context->chars_written + cVar4;
      if (context->cursor == (char *)0x0) {
        __s = (char *)0x0;
      }
      else {
        __s = context->cursor + cVar4;
        context->cursor = __s;
        context->remaining = context->remaining - cVar4;
      }
      cVar3 = cVar3 + 1;
    } while (dim != cVar3);
  }
  iVar2 = snprintf(__s,context->remaining,"]");
  cVar3 = (cgltf_size)iVar2;
  context->tmp = cVar3;
  context->chars_written = context->chars_written + cVar3;
  if (context->cursor != (char *)0x0) {
    context->cursor = context->cursor + cVar3;
    context->remaining = context->remaining - cVar3;
  }
  context->needs_comma = 1;
  return;
}

Assistant:

static void cgltf_write_floatarrayprop(cgltf_write_context* context, const char* label, const cgltf_float* vals, cgltf_size dim)
{
	cgltf_write_indent(context);
	CGLTF_SPRINTF("\"%s\": [", label);
	for (cgltf_size i = 0; i < dim; ++i)
	{
		if (i != 0)
		{
			CGLTF_SPRINTF(", %.*g", CGLTF_DECIMAL_DIG, vals[i]);
		}
		else
		{
			CGLTF_SPRINTF("%.*g", CGLTF_DECIMAL_DIG, vals[i]);
		}
	}
	CGLTF_SPRINTF("]");
	context->needs_comma = 1;
}